

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_draw.cpp
# Opt level: O3

void ImFontAtlasBuildPackCustomRects(ImFontAtlas *atlas,void *stbrp_context_opaque)

{
  ushort uVar1;
  ushort uVar2;
  uint num_rects;
  ImFontAtlasCustomRect *pIVar3;
  stbrp_rect *rects;
  char *__function;
  long lVar4;
  ulong uVar5;
  int iVar6;
  ulong uVar7;
  ulong uVar8;
  ImVector<stbrp_rect> pack_rects;
  
  if (stbrp_context_opaque == (void *)0x0) {
    __assert_fail("pack_context != __null",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0xa2e,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  num_rects = (atlas->CustomRects).Size;
  uVar8 = (ulong)num_rects;
  if ((int)num_rects < 1) {
    __assert_fail("user_rects.Size >= 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                  ,0xa31,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
  }
  uVar7 = 8;
  if (8 < num_rects) {
    uVar7 = (ulong)num_rects;
  }
  rects = (stbrp_rect *)ImGui::MemAlloc(uVar7 << 4);
  memset(rects,0,(ulong)(num_rects << 4));
  uVar7 = (ulong)(atlas->CustomRects).Size;
  if (0 < (long)uVar7) {
    pIVar3 = (atlas->CustomRects).Data;
    lVar4 = 4;
    uVar5 = 0;
    do {
      if (uVar8 <= uVar5) goto LAB_00136581;
      *(undefined2 *)((long)&rects->id + lVar4) = *(undefined2 *)((long)pIVar3 + lVar4 * 2 + -8);
      if ((long)(atlas->CustomRects).Size <= (long)uVar5) goto LAB_0013656a;
      *(undefined2 *)((long)&rects->id + lVar4 + 2) = *(undefined2 *)((long)pIVar3 + lVar4 * 2 + -6)
      ;
      uVar5 = uVar5 + 1;
      lVar4 = lVar4 + 0x10;
    } while (uVar7 != uVar5);
  }
  stbrp_pack_rects((stbrp_context *)stbrp_context_opaque,rects,num_rects);
  lVar4 = 0;
  uVar7 = 0;
  do {
    if (*(int *)((long)&rects->was_packed + lVar4) != 0) {
      if ((long)(atlas->CustomRects).Size <= (long)uVar7) goto LAB_0013656a;
      pIVar3 = (atlas->CustomRects).Data;
      (&pIVar3->X)[lVar4] = *(unsigned_short *)((long)&rects->x + lVar4);
      if (uVar8 <= uVar7) break;
      if ((long)(atlas->CustomRects).Size <= (long)uVar7) goto LAB_0013656a;
      uVar1 = *(ushort *)((long)&rects->y + lVar4);
      (&pIVar3->Y)[lVar4] = uVar1;
      if ((long)(atlas->CustomRects).Size <= (long)uVar7) goto LAB_0013656a;
      if ((*(unsigned_short *)((long)&rects->w + lVar4) != (&pIVar3->Width)[lVar4]) ||
         (uVar2 = *(ushort *)((long)&rects->h + lVar4), uVar2 != (&pIVar3->Height)[lVar4])) {
        __assert_fail("pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui_draw.cpp"
                      ,0xa41,"void ImFontAtlasBuildPackCustomRects(ImFontAtlas *, void *)");
      }
      iVar6 = (uint)uVar2 + (uint)uVar1;
      if (iVar6 < atlas->TexHeight) {
        iVar6 = atlas->TexHeight;
      }
      atlas->TexHeight = iVar6;
    }
    uVar7 = uVar7 + 1;
    lVar4 = lVar4 + 0x10;
    if (uVar8 == uVar7) {
      ImGui::MemFree(rects);
      return;
    }
  } while( true );
LAB_00136581:
  __function = "T &ImVector<stbrp_rect>::operator[](int) [T = stbrp_rect]";
  goto LAB_00136596;
LAB_0013656a:
  __function = "T &ImVector<ImFontAtlasCustomRect>::operator[](int) [T = ImFontAtlasCustomRect]";
LAB_00136596:
  __assert_fail("i >= 0 && i < Size",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/libs/imgui/imgui.h"
                ,0x68b,__function);
}

Assistant:

void ImFontAtlasBuildPackCustomRects(ImFontAtlas* atlas, void* stbrp_context_opaque)
{
    stbrp_context* pack_context = (stbrp_context*)stbrp_context_opaque;
    IM_ASSERT(pack_context != NULL);

    ImVector<ImFontAtlasCustomRect>& user_rects = atlas->CustomRects;
    IM_ASSERT(user_rects.Size >= 1); // We expect at least the default custom rects to be registered, else something went wrong.

    ImVector<stbrp_rect> pack_rects;
    pack_rects.resize(user_rects.Size);
    memset(pack_rects.Data, 0, (size_t)pack_rects.size_in_bytes());
    for (int i = 0; i < user_rects.Size; i++)
    {
        pack_rects[i].w = user_rects[i].Width;
        pack_rects[i].h = user_rects[i].Height;
    }
    stbrp_pack_rects(pack_context, &pack_rects[0], pack_rects.Size);
    for (int i = 0; i < pack_rects.Size; i++)
        if (pack_rects[i].was_packed)
        {
            user_rects[i].X = pack_rects[i].x;
            user_rects[i].Y = pack_rects[i].y;
            IM_ASSERT(pack_rects[i].w == user_rects[i].Width && pack_rects[i].h == user_rects[i].Height);
            atlas->TexHeight = ImMax(atlas->TexHeight, pack_rects[i].y + pack_rects[i].h);
        }
}